

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall
QTableView::selectionChanged(QTableView *this,QItemSelection *selected,QItemSelection *deselected)

{
  bool bVar1;
  int chld;
  ulong uVar2;
  QItemSelection *in_RDX;
  QModelIndex *in_RSI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int entry_1;
  int entry;
  QTableViewPrivate *d;
  QModelIndex desel;
  QModelIndex sel;
  QAccessibleEvent event_1;
  QAccessibleEvent event;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QTableViewPrivate *this_00;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QTableView *)0x8c15e9);
  uVar2 = QAccessible::isActive();
  if ((uVar2 & 1) != 0) {
    QItemSelection::indexes();
    QList<QModelIndex>::value((QList<QModelIndex> *)this_00,(qsizetype)in_RSI);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8c1652);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    if (bVar1) {
      in_stack_ffffffffffffff34 = QTableViewPrivate::accessibleTable2Index(this_00,in_RSI);
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent
                ((QAccessibleEvent *)&local_28,(QObject *)in_RDI,SelectionAdd);
      QAccessibleEvent::setChild((QAccessibleEvent *)&local_28,in_stack_ffffffffffffff34);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
    }
    QItemSelection::indexes();
    QList<QModelIndex>::value((QList<QModelIndex> *)this_00,(qsizetype)in_RSI);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8c1745);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    if (bVar1) {
      chld = QTableViewPrivate::accessibleTable2Index(this_00,in_RSI);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent
                ((QAccessibleEvent *)&local_48,(QObject *)in_RDI,SelectionRemove);
      QAccessibleEvent::setChild((QAccessibleEvent *)&local_48,chld);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
    }
  }
  QAbstractItemView::selectionChanged((QAbstractItemView *)this_00,(QItemSelection *)in_RSI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::selectionChanged(const QItemSelection &selected,
                                  const QItemSelection &deselected)
{
    Q_D(QTableView);
    Q_UNUSED(d);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTable2Index(sel);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTable2Index(desel);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
    QAbstractItemView::selectionChanged(selected, deselected);
}